

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O2

void __thiscall
btDbvtBroadphase::btDbvtBroadphase(btDbvtBroadphase *this,btOverlappingPairCache *paircache)

{
  int i;
  long lVar1;
  
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btDbvtBroadphase_001ec070;
  btDbvt::btDbvt((btDbvt *)&this->field_0x8);
  btDbvt::btDbvt((btDbvt *)&this->field_0x68);
  this->m_deferedcollide = false;
  this->m_needcleanup = true;
  this->m_prediction = 0.0;
  this->m_updates_ratio = 0.0;
  this->m_releasepaircache = paircache == (btOverlappingPairCache *)0x0;
  this->m_stageCurrent = 0;
  this->m_fupdates = 1;
  this->m_dupdates = 0;
  this->m_cupdates = 10;
  this->m_newpairs = 1;
  this->m_fixedleft = 0;
  this->m_updates_call = 0;
  this->m_updates_done = 0;
  if (paircache == (btOverlappingPairCache *)0x0) {
    paircache = (btOverlappingPairCache *)btAlignedAllocInternal(0x78,0x10);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache
              ((btHashedOverlappingPairCache *)paircache);
  }
  this->m_paircache = paircache;
  this->m_gid = 0;
  this->m_pid = 0;
  this->m_cid = 0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    this->m_stageRoots[lVar1] = (btDbvtProxy *)0x0;
  }
  return;
}

Assistant:

btDbvtBroadphase::btDbvtBroadphase(btOverlappingPairCache* paircache)
{
	m_deferedcollide	=	false;
	m_needcleanup		=	true;
	m_releasepaircache	=	(paircache!=0)?false:true;
	m_prediction		=	0;
	m_stageCurrent		=	0;
	m_fixedleft			=	0;
	m_fupdates			=	1;
	m_dupdates			=	0;
	m_cupdates			=	10;
	m_newpairs			=	1;
	m_updates_call		=	0;
	m_updates_done		=	0;
	m_updates_ratio		=	0;
	m_paircache			=	paircache? paircache	: new(btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16)) btHashedOverlappingPairCache();
	m_gid				=	0;
	m_pid				=	0;
	m_cid				=	0;
	for(int i=0;i<=STAGECOUNT;++i)
	{
		m_stageRoots[i]=0;
	}
#if DBVT_BP_PROFILE
	clear(m_profiling);
#endif
}